

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_owner_id(id_array *ids,int64_t id)

{
  uint uVar1;
  uint local_2c;
  uint t;
  uint m;
  uint b;
  int64_t id_local;
  id_array *ids_local;
  
  local_2c = 0;
  uVar1 = (uint)ids->count;
  while( true ) {
    t = uVar1;
    if (t <= local_2c) {
      return L'\0';
    }
    uVar1 = local_2c + t >> 1;
    if (ids->ids[uVar1] == id) break;
    if (ids->ids[uVar1] < id) {
      local_2c = uVar1 + 1;
      uVar1 = t;
    }
  }
  return L'\x01';
}

Assistant:

static int
match_owner_id(struct id_array *ids, int64_t id)
{
	unsigned b, m, t;

	t = 0;
	b = (unsigned)ids->count;
	while (t < b) {
		m = (t + b)>>1;
		if (ids->ids[m] == id)
			return (1);
		if (ids->ids[m] < id)
			t = m + 1;
		else
			b = m;
	}
	return (0);
}